

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

int __thiscall QSimplex::findPivotColumn(QSimplex *this)

{
  QSimplex *in_RDI;
  qreal qVar1;
  int j;
  int minIndex;
  qreal min;
  int local_18;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = -1;
  for (local_18 = 0; local_18 < in_RDI->columns + -1; local_18 = local_18 + 1) {
    qVar1 = valueAt(in_RDI,0,local_18);
    if (qVar1 < local_10) {
      local_10 = valueAt(in_RDI,0,local_18);
      local_14 = local_18;
    }
  }
  return local_14;
}

Assistant:

int QSimplex::findPivotColumn()
{
    qreal min = 0;
    int minIndex = -1;

    for (int j = 0; j < columns-1; ++j) {
        if (valueAt(0, j) < min) {
            min = valueAt(0, j);
            minIndex = j;
        }
    }

    return minIndex;
}